

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

QNonContiguousByteDevice * __thiscall
QNetworkReplyHttpImplPrivate::createUploadByteDevice(QNetworkReplyHttpImplPrivate *this)

{
  char *pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  QNonContiguousByteDevice *pQVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long in_FS_OFFSET;
  QObject local_50 [8];
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QNetworkReplyPrivate).field_0x8;
  peVar2 = (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    if (this->outgoingData == (QIODevice *)0x0) {
      pQVar5 = (QNonContiguousByteDevice *)0x0;
      goto LAB_0021aa4d;
    }
    QNonContiguousByteDeviceFactory::createShared((QIODevice *)&local_38);
    p_Var6 = p_Stack_30;
    peVar4 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (this->uploadByteDevice).
             super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->uploadByteDevice).
    super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (this->uploadByteDevice).
    super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6;
    p_Var6 = p_Stack_30;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      p_Var6 = p_Stack_30;
    }
  }
  else {
    local_40 = (this->outgoingDataBuffer).
               super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_40->_M_use_count = local_40->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_40->_M_use_count = local_40->_M_use_count + 1;
      }
    }
    local_48 = peVar2;
    QNonContiguousByteDeviceFactory::createShared(&local_38,&local_48);
    p_Var6 = p_Stack_30;
    peVar4 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (this->uploadByteDevice).
             super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->uploadByteDevice).
    super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    (this->uploadByteDevice).
    super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var6;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    p_Var6 = local_40;
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      p_Var6 = local_40;
    }
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  if (this->synchronous == false) {
    QObject::connect(local_50,(char *)(this->uploadByteDevice).
                                      super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(QObject *)"2readProgress(qint64,qint64)",pcVar1,
                     0x2714c6);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  pQVar5 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0021aa4d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

QNonContiguousByteDevice* QNetworkReplyHttpImplPrivate::createUploadByteDevice()
{
    Q_Q(QNetworkReplyHttpImpl);

    if (outgoingDataBuffer)
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingDataBuffer);
    else if (outgoingData) {
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!synchronous)
        QObject::connect(uploadByteDevice.get(), SIGNAL(readProgress(qint64,qint64)),
                         q, SLOT(emitReplyUploadProgress(qint64,qint64)));

    return uploadByteDevice.get();
}